

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O2

Vec_Int_t * Pdr_InvMinimizeLits(Gia_Man_t *p,Vec_Int_t *vInv,int fVerbose)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  abctime aVar4;
  Cnf_Dat_t *p_00;
  sat_solver *pSat;
  abctime aVar5;
  Vec_Int_t *p_01;
  ulong uVar6;
  uint uVar7;
  abctime time;
  uint *puVar8;
  char *pStr;
  Gia_Man_t *pGVar9;
  uint *puVar10;
  ulong uVar11;
  long lVar12;
  uint local_6c;
  
  aVar4 = Abc_Clock();
  piVar1 = vInv->pArray;
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  puVar10 = (uint *)(piVar1 + 1);
  local_6c = 0;
  puVar8 = puVar10;
  for (uVar7 = 0; (int)uVar7 < *piVar1; uVar7 = uVar7 + 1) {
    uVar2 = *puVar8;
    for (uVar11 = 0; (long)uVar11 < (long)(int)uVar2; uVar11 = uVar11 + 1) {
      uVar2 = puVar8[uVar11 + 1];
      puVar8[uVar11 + 1] = 0xffffffff;
      pSat = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
      pGVar9 = p;
      iVar3 = Pdr_InvCheck_int(p,vInv,0,pSat,1);
      if (iVar3 == 0) {
        if (fVerbose != 0) {
          Abc_Print((int)pGVar9,"Removing lit %d from clause %d.\n",uVar11 & 0xffffffff,(ulong)uVar7
                   );
        }
        local_6c = local_6c + 1;
      }
      else {
        puVar8[uVar11 + 1] = uVar2;
      }
      sat_solver_delete(pSat);
      uVar2 = *puVar8;
    }
    puVar8 = puVar8 + (long)(int)uVar2 + 1;
  }
  Cnf_DataFree(p_00);
  if (local_6c == 0) {
    pStr = "Invariant minimization did not change the invariant.  ";
    Abc_Print((int)p_00,"Invariant minimization did not change the invariant.  ");
  }
  else {
    pStr = "Invariant minimization reduced %d literals (out of %d).  ";
    Abc_Print((int)p_00,"Invariant minimization reduced %d literals (out of %d).  ",(ulong)local_6c)
    ;
  }
  aVar5 = Abc_Clock();
  Abc_PrintTime((int)aVar5 - (int)aVar4,pStr,time);
  iVar3 = 0;
  if ((int)local_6c < 1) {
    p_01 = (Vec_Int_t *)0x0;
  }
  else {
    p_01 = Vec_IntAlloc(1000);
    Vec_IntPush(p_01,*piVar1);
LAB_004dc4a1:
    if (iVar3 < *piVar1) {
      uVar11 = 0;
      uVar6 = (ulong)*puVar10;
      if ((int)*puVar10 < 1) {
        uVar6 = uVar11;
      }
      uVar7 = 0;
      for (; uVar6 != uVar11; uVar11 = uVar11 + 1) {
        uVar7 = uVar7 + (puVar10[uVar11 + 1] != 0xffffffff);
      }
      lVar12 = 0;
      do {
        Vec_IntPush(p_01,uVar7);
        do {
          if ((int)*puVar10 <= lVar12) {
            iVar3 = iVar3 + 1;
            puVar10 = puVar10 + (long)(int)*puVar10 + 1;
            goto LAB_004dc4a1;
          }
          uVar7 = puVar10[lVar12 + 1];
          lVar12 = lVar12 + 1;
        } while (uVar7 == 0xffffffff);
      } while( true );
    }
    iVar3 = Vec_IntEntryLast(vInv);
    Vec_IntPush(p_01,iVar3);
  }
  return p_01;
}

Assistant:

Vec_Int_t * Pdr_InvMinimizeLits( Gia_Man_t * p, Vec_Int_t * vInv, int fVerbose )
{
    Vec_Int_t * vRes = NULL;
    abctime clk = Abc_Clock();
    int i, k, nLits = 0, * pCube, * pList = Vec_IntArray(vInv), nRemoved = 0;
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat;
//    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    Pdr_ForEachCube( pList, pCube, i )
    {
        nLits += pCube[0];
        for ( k = 0; k < pCube[0]; k++ )
        {
            int Save = pCube[k+1];
            pCube[k+1] = -1;
            //sat_solver_bookmark( pSat );
            pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
            if ( Pdr_InvCheck_int(p, vInv, 0, pSat, 1) )
                pCube[k+1] = Save;
            else
            {
                if ( fVerbose )
                Abc_Print(1, "Removing lit %d from clause %d.\n", k, i );
                nRemoved++;
            }
            sat_solver_delete( pSat );
            //sat_solver_rollback( pSat );
            //sat_solver_bookmark( pSat );
        }
    }
    Cnf_DataFree( pCnf );
    //sat_solver_delete( pSat );
    if ( nRemoved )
        Abc_Print(1, "Invariant minimization reduced %d literals (out of %d).  ", nRemoved, nLits );
    else
        Abc_Print(1, "Invariant minimization did not change the invariant.  " ); 
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( nRemoved > 0 ) // finished without timeout and removed some lits
    {
        vRes = Vec_IntAlloc( 1000 );
        Vec_IntPush( vRes, pList[0] );
        Pdr_ForEachCube( pList, pCube, i )
        {
            int nLits = 0;
            for ( k = 0; k < pCube[0]; k++ )
                if ( pCube[k+1] != -1 )
                    nLits++;
            Vec_IntPush( vRes, nLits );
            for ( k = 0; k < pCube[0]; k++ )
                if ( pCube[k+1] != -1 )
                    Vec_IntPush( vRes, pCube[k+1] );
        }
        Vec_IntPush( vRes, Vec_IntEntryLast(vInv) );
    }
    return vRes;
}